

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cio.c
# Opt level: O1

void opj_write_bytes_BE(OPJ_BYTE *p_buffer,OPJ_UINT32 p_value,OPJ_UINT32 p_nb_bytes)

{
  if (p_nb_bytes - 1 < 4) {
    memcpy(p_buffer,&stack0x00000000 + -(ulong)p_nb_bytes,(ulong)p_nb_bytes);
    return;
  }
  __assert_fail("p_nb_bytes > 0 && p_nb_bytes <= sizeof(OPJ_UINT32)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/cio.c"
                ,0x35,"void opj_write_bytes_BE(OPJ_BYTE *, OPJ_UINT32, OPJ_UINT32)");
}

Assistant:

void opj_write_bytes_BE(OPJ_BYTE * p_buffer, OPJ_UINT32 p_value,
                        OPJ_UINT32 p_nb_bytes)
{
    const OPJ_BYTE * l_data_ptr = ((const OPJ_BYTE *) &p_value) + sizeof(
                                      OPJ_UINT32) - p_nb_bytes;

    assert(p_nb_bytes > 0 && p_nb_bytes <=  sizeof(OPJ_UINT32));

    memcpy(p_buffer, l_data_ptr, p_nb_bytes);
}